

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSliderConstraint.cpp
# Opt level: O0

void __thiscall
btSliderConstraint::getInfo2NonVirtual
          (btSliderConstraint *this,btConstraintInfo2 *info,btTransform *transA,btTransform *transB,
          btVector3 *linVelA,btVector3 *linVelB,btScalar rbAinvMass,btScalar rbBinvMass)

{
  float *pfVar1;
  float fVar2;
  bool bVar3;
  btScalar *pbVar4;
  btVector3 *pbVar5;
  float *in_RSI;
  btSliderConstraint *in_RDI;
  btVector3 *in_R8;
  btVector3 *in_R9;
  float in_XMM0_Da;
  btScalar bVar6;
  btScalar bVar7;
  btScalar bVar8;
  float fVar9;
  btScalar vel_00;
  btScalar bVar10;
  float in_XMM1_Da;
  btVector3 bVar11;
  btScalar newc_3;
  btScalar newc_2;
  btScalar vel_1;
  btScalar bounce_1;
  btScalar mot_fact_1;
  btScalar histop_1;
  btScalar lostop_1;
  btScalar newc_1;
  btScalar newc;
  btScalar vel;
  btScalar bounce;
  btScalar mot_fact;
  btScalar tag_vel;
  btScalar histop;
  btScalar lostop;
  btVector3 ltd;
  btScalar rhs;
  btVector3 tmp;
  btScalar len2;
  btVector3 totalDist;
  btScalar sliderOffs;
  btVector3 orthoA;
  btVector3 projA;
  btVector3 orthoB;
  btVector3 projB;
  btVector3 c;
  btVector3 relB;
  btVector3 relA;
  btVector3 tmpB;
  btVector3 tmpA;
  int s3;
  int s2;
  btTransform bodyB_trans;
  btTransform bodyA_trans;
  int powered;
  int limit;
  btScalar limit_err;
  int srow;
  int nrow;
  btVector3 u;
  btScalar k;
  btScalar currERP;
  btVector3 ax1B;
  btVector3 ax1A;
  btVector3 q;
  btVector3 p;
  btVector3 ax1;
  btScalar factB;
  btScalar factA;
  btScalar miS;
  bool hasStaticBody;
  btScalar miB;
  btScalar miA;
  btVector3 ofs;
  btScalar signFact;
  int s;
  int i;
  btTransform *trB;
  btTransform *trA;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  undefined4 in_stack_fffffffffffffa40;
  btScalar uppLim;
  undefined4 in_stack_fffffffffffffa44;
  undefined4 in_stack_fffffffffffffa48;
  int in_stack_fffffffffffffa4c;
  undefined4 in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa54;
  float local_57c;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  btVector3 *in_stack_fffffffffffffa98;
  btVector3 *in_stack_fffffffffffffaa0;
  float local_4e0;
  bool local_4c9;
  float local_4bc;
  btScalar local_47c [2];
  btScalar local_474 [2];
  btVector3 local_46c;
  btScalar local_45c [4];
  btScalar local_44c [4];
  float local_43c;
  btScalar local_438 [4];
  btVector3 local_428;
  btScalar local_418 [4];
  btScalar local_408 [4];
  btScalar local_3f8 [4];
  btScalar local_3e8 [4];
  btScalar local_3d8 [4];
  btScalar local_3c8 [4];
  btScalar local_3b8 [4];
  btScalar local_3a8;
  btScalar local_3a4;
  btScalar local_3a0 [4];
  btScalar local_390 [4];
  btScalar local_380 [4];
  btScalar local_370 [4];
  btScalar local_360 [4];
  btScalar local_350 [4];
  btScalar local_340 [4];
  btScalar local_330 [4];
  btScalar local_320 [4];
  btScalar local_310 [4];
  float local_300;
  btScalar local_2fc [4];
  btScalar local_2ec;
  btScalar local_2e8 [4];
  btScalar local_2d8 [4];
  btScalar local_2c8 [4];
  btScalar local_2b8;
  btScalar local_2b4 [4];
  btScalar local_2a4 [4];
  btScalar local_294;
  btScalar local_290;
  btScalar local_28c;
  btVector3 local_288;
  btScalar local_274;
  btScalar local_270;
  btScalar local_26c;
  btVector3 local_268;
  btScalar local_254;
  btScalar local_250;
  btScalar local_24c;
  btVector3 local_248;
  btScalar local_230;
  btScalar local_22c;
  btScalar local_228;
  btVector3 local_224;
  btScalar local_214;
  btScalar local_210;
  btScalar local_20c;
  btVector3 local_208;
  int local_1ec;
  int local_1e8;
  btTransform local_1e4;
  btTransform local_1a4;
  int local_164;
  int local_160;
  float local_15c;
  int local_158;
  int local_154;
  btVector3 local_150;
  float local_140;
  float local_13c;
  btScalar local_138 [4];
  btScalar local_128 [4];
  btScalar local_118 [4];
  btScalar local_108 [4];
  btScalar local_f8 [4];
  btScalar local_e8 [4];
  btScalar local_d8 [4];
  btScalar local_c8 [4];
  btVector3 local_b8;
  btVector3 local_a8;
  btVector3 local_98;
  float local_7c;
  btScalar local_78;
  float local_74;
  bool local_6d;
  float local_6c;
  float local_68;
  btVector3 local_64;
  float local_54;
  float local_50;
  int local_4c;
  btTransform *local_48;
  btTransform *local_40;
  float local_38;
  float local_34;
  btVector3 *local_30;
  btVector3 *local_28;
  float *local_10;
  
  local_38 = in_XMM1_Da;
  local_34 = in_XMM0_Da;
  local_30 = in_R9;
  local_28 = in_R8;
  local_10 = in_RSI;
  local_40 = getCalculatedTransformA(in_RDI);
  local_48 = getCalculatedTransformB(in_RDI);
  local_50 = local_10[10];
  local_4bc = 1.0;
  if ((in_RDI->m_useLinearReferenceFrameA & 1U) == 0) {
    local_4bc = -1.0;
  }
  local_54 = local_4bc;
  btTransform::getOrigin(local_48);
  btTransform::getOrigin(local_40);
  local_64 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  local_68 = local_34;
  local_6c = local_38;
  local_4c9 = local_34 < 1.1920929e-07 || local_38 < 1.1920929e-07;
  local_6d = local_4c9;
  local_74 = local_34 + local_38;
  if (local_74 <= 0.0) {
    local_78 = 0.5;
  }
  else {
    local_78 = local_38 / local_74;
  }
  local_7c = 1.0 - local_78;
  btVector3::btVector3(&local_98);
  btVector3::btVector3(&local_a8);
  btVector3::btVector3(&local_b8);
  btTransform::getBasis(local_40);
  local_c8 = (btScalar  [4])
             btMatrix3x3::getColumn
                       ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50)
                        ,in_stack_fffffffffffffa4c);
  btTransform::getBasis(local_48);
  local_d8 = (btScalar  [4])
             btMatrix3x3::getColumn
                       ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50)
                        ,in_stack_fffffffffffffa4c);
  if ((in_RDI->m_useOffsetForConstraintFrame & 1U) == 0) {
    btTransform::getBasis(local_40);
    bVar11 = btMatrix3x3::getColumn
                       ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50)
                        ,in_stack_fffffffffffffa4c);
    local_118._0_8_ = bVar11.m_floats._0_8_;
    local_118._8_8_ = bVar11.m_floats._8_8_;
    local_98.m_floats[0] = local_118[0];
    local_98.m_floats[1] = local_118[1];
    local_98.m_floats[2] = local_118[2];
    local_98.m_floats[3] = local_118[3];
    local_118 = bVar11.m_floats;
    btTransform::getBasis(local_40);
    bVar11 = btMatrix3x3::getColumn
                       ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50)
                        ,in_stack_fffffffffffffa4c);
    local_128._0_8_ = bVar11.m_floats._0_8_;
    local_128._8_8_ = bVar11.m_floats._8_8_;
    local_a8.m_floats[0] = local_128[0];
    local_a8.m_floats[1] = local_128[1];
    local_a8.m_floats[2] = local_128[2];
    local_a8.m_floats[3] = local_128[3];
    local_128 = bVar11.m_floats;
    btTransform::getBasis(local_40);
    bVar11 = btMatrix3x3::getColumn
                       ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50)
                        ,in_stack_fffffffffffffa4c);
    local_138._0_8_ = bVar11.m_floats._0_8_;
    local_b8.m_floats[0] = local_138[0];
    local_b8.m_floats[1] = local_138[1];
    local_138._8_8_ = bVar11.m_floats._8_8_;
    local_b8.m_floats[2] = local_138[2];
    local_b8.m_floats[3] = local_138[3];
    local_138 = bVar11.m_floats;
  }
  else {
    local_f8 = (btScalar  [4])
               ::operator*((btVector3 *)
                           CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                           (btScalar *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48)
                          );
    local_108 = (btScalar  [4])
                ::operator*((btVector3 *)
                            CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                            (btScalar *)
                            CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    bVar11 = operator+((btVector3 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    local_e8._0_8_ = bVar11.m_floats._0_8_;
    local_98.m_floats[0] = local_e8[0];
    local_98.m_floats[1] = local_e8[1];
    local_e8._8_8_ = bVar11.m_floats._8_8_;
    local_98.m_floats[2] = local_e8[2];
    local_98.m_floats[3] = local_e8[3];
    local_e8 = bVar11.m_floats;
    btVector3::normalize((btVector3 *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40))
    ;
    btPlaneSpace1<btVector3>
              (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
               (btVector3 *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90));
  }
  pbVar4 = btVector3::operator_cast_to_float_(&local_a8);
  **(btScalar **)(local_10 + 4) = *pbVar4;
  pbVar4 = btVector3::operator_cast_to_float_(&local_a8);
  *(btScalar *)(*(long *)(local_10 + 4) + 4) = pbVar4[1];
  pbVar4 = btVector3::operator_cast_to_float_(&local_a8);
  *(btScalar *)(*(long *)(local_10 + 4) + 8) = pbVar4[2];
  pbVar4 = btVector3::operator_cast_to_float_(&local_b8);
  *(btScalar *)(*(long *)(local_10 + 4) + (long)(int)local_50 * 4) = *pbVar4;
  pbVar4 = btVector3::operator_cast_to_float_(&local_b8);
  *(btScalar *)(*(long *)(local_10 + 4) + (long)((int)local_50 + 1) * 4) = pbVar4[1];
  pbVar4 = btVector3::operator_cast_to_float_(&local_b8);
  *(btScalar *)(*(long *)(local_10 + 4) + (long)((int)local_50 + 2) * 4) = pbVar4[2];
  pbVar4 = btVector3::operator_cast_to_float_(&local_a8);
  **(btScalar **)(local_10 + 8) = -*pbVar4;
  pbVar4 = btVector3::operator_cast_to_float_(&local_a8);
  *(float *)(*(long *)(local_10 + 8) + 4) = -pbVar4[1];
  pbVar4 = btVector3::operator_cast_to_float_(&local_a8);
  *(float *)(*(long *)(local_10 + 8) + 8) = -pbVar4[2];
  pbVar4 = btVector3::operator_cast_to_float_(&local_b8);
  *(float *)(*(long *)(local_10 + 8) + (long)(int)local_50 * 4) = -*pbVar4;
  pbVar4 = btVector3::operator_cast_to_float_(&local_b8);
  *(float *)(*(long *)(local_10 + 8) + (long)((int)local_50 + 1) * 4) = -pbVar4[1];
  pbVar4 = btVector3::operator_cast_to_float_(&local_b8);
  *(float *)(*(long *)(local_10 + 8) + (long)((int)local_50 + 2) * 4) = -pbVar4[2];
  if ((in_RDI->m_flags & 0x80U) == 0) {
    local_4e0 = in_RDI->m_softnessOrthoAng * local_10[1];
  }
  else {
    local_4e0 = in_RDI->m_softnessOrthoAng;
  }
  local_13c = local_4e0;
  local_140 = *local_10 * local_4e0;
  local_150 = btVector3::cross((btVector3 *)
                               CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                               (btVector3 *)
                               CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
  fVar9 = local_140;
  bVar6 = btVector3::dot(&local_150,&local_a8);
  fVar2 = local_140;
  **(float **)(local_10 + 0xc) = fVar9 * bVar6;
  bVar6 = btVector3::dot(&local_150,&local_b8);
  *(float *)(*(long *)(local_10 + 0xc) + (long)(int)local_50 * 4) = fVar2 * bVar6;
  if ((in_RDI->m_flags & 0x40U) != 0) {
    **(btScalar **)(local_10 + 0xe) = in_RDI->m_cfmOrthoAng;
    *(btScalar *)(*(long *)(local_10 + 0xe) + (long)(int)local_50 * 4) = in_RDI->m_cfmOrthoAng;
  }
  local_154 = 1;
  btTransform::btTransform
            ((btTransform *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
             (btTransform *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
  btTransform::btTransform
            ((btTransform *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
             (btTransform *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
  local_1e8 = (local_154 + 1) * (int)local_50;
  local_154 = local_154 + 2;
  local_1ec = local_154 * (int)local_50;
  local_20c = 0.0;
  local_210 = 0.0;
  local_214 = 0.0;
  btVector3::btVector3(&local_208,&local_20c,&local_210,&local_214);
  local_228 = 0.0;
  local_22c = 0.0;
  local_230 = 0.0;
  btVector3::btVector3(&local_224,&local_228,&local_22c,&local_230);
  local_24c = 0.0;
  local_250 = 0.0;
  local_254 = 0.0;
  btVector3::btVector3(&local_248,&local_24c,&local_250,&local_254);
  local_26c = 0.0;
  local_270 = 0.0;
  local_274 = 0.0;
  btVector3::btVector3(&local_268,&local_26c,&local_270,&local_274);
  local_28c = 0.0;
  local_290 = 0.0;
  local_294 = 0.0;
  btVector3::btVector3(&local_288,&local_28c,&local_290,&local_294);
  if ((in_RDI->m_useOffsetForConstraintFrame & 1U) == 0) {
    btTransform::getOrigin(&local_1e4);
    btTransform::getOrigin(&local_1a4);
    bVar11 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    local_418._0_8_ = bVar11.m_floats._0_8_;
    local_418._8_8_ = bVar11.m_floats._8_8_;
    local_288.m_floats[0] = local_418[0];
    local_288.m_floats[1] = local_418[1];
    local_288.m_floats[2] = local_418[2];
    local_288.m_floats[3] = local_418[3];
    local_418 = bVar11.m_floats;
    local_428 = btVector3::cross((btVector3 *)
                                 CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                                 (btVector3 *)
                                 CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      bVar6 = local_78;
      pbVar4 = btVector3::operator_cast_to_float_(&local_428);
      *(float *)(*(long *)(local_10 + 4) + (long)(local_1e8 + local_4c) * 4) =
           bVar6 * pbVar4[local_4c];
    }
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      fVar9 = local_7c;
      pbVar4 = btVector3::operator_cast_to_float_(&local_428);
      *(float *)(*(long *)(local_10 + 8) + (long)(local_1e8 + local_4c) * 4) =
           fVar9 * pbVar4[local_4c];
    }
    local_438 = (btScalar  [4])
                btVector3::cross((btVector3 *)
                                 CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                                 (btVector3 *)
                                 CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    local_428 = (btVector3)local_438;
    for (local_4c = 0; bVar6 = local_78, local_4c < 3; local_4c = local_4c + 1) {
      pbVar4 = btVector3::operator_cast_to_float_(&local_428);
      *(float *)(*(long *)(local_10 + 4) + (long)(local_1ec + local_4c) * 4) =
           bVar6 * pbVar4[local_4c];
    }
    for (local_4c = 0; fVar9 = local_7c, local_4c < 3; local_4c = local_4c + 1) {
      pbVar4 = btVector3::operator_cast_to_float_(&local_428);
      *(float *)(*(long *)(local_10 + 8) + (long)(local_1ec + local_4c) * 4) =
           fVar9 * pbVar4[local_4c];
    }
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      pbVar4 = btVector3::operator_cast_to_float_(&local_a8);
      *(btScalar *)(*(long *)(local_10 + 2) + (long)(local_1e8 + local_4c) * 4) = pbVar4[local_4c];
    }
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      pbVar4 = btVector3::operator_cast_to_float_(&local_b8);
      *(btScalar *)(*(long *)(local_10 + 2) + (long)(local_1ec + local_4c) * 4) = pbVar4[local_4c];
    }
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      pbVar4 = btVector3::operator_cast_to_float_(&local_a8);
      *(float *)(*(long *)(local_10 + 6) + (long)(local_1e8 + local_4c) * 4) = -pbVar4[local_4c];
    }
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      pbVar4 = btVector3::operator_cast_to_float_(&local_b8);
      *(float *)(*(long *)(local_10 + 6) + (long)(local_1ec + local_4c) * 4) = -pbVar4[local_4c];
    }
  }
  else {
    btTransform::getOrigin(local_48);
    btTransform::getOrigin(&local_1e4);
    bVar11 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    local_2a4._0_8_ = bVar11.m_floats._0_8_;
    local_2a4._8_8_ = bVar11.m_floats._8_8_;
    local_268.m_floats[0] = local_2a4[0];
    local_268.m_floats[1] = local_2a4[1];
    local_268.m_floats[2] = local_2a4[2];
    local_268.m_floats[3] = local_2a4[3];
    local_2a4 = bVar11.m_floats;
    local_2b8 = btVector3::dot(&local_268,&local_98);
    local_2b4 = (btScalar  [4])
                ::operator*((btVector3 *)
                            CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                            (btScalar *)
                            CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    local_2c8 = (btScalar  [4])
                operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50)
                          ,(btVector3 *)
                           CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    btTransform::getOrigin(local_40);
    btTransform::getOrigin(&local_1a4);
    bVar11 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    local_2d8._0_8_ = bVar11.m_floats._0_8_;
    local_2d8._8_8_ = bVar11.m_floats._8_8_;
    local_248.m_floats[0] = local_2d8[0];
    local_248.m_floats[1] = local_2d8[1];
    local_248.m_floats[2] = local_2d8[2];
    local_248.m_floats[3] = local_2d8[3];
    local_2d8 = bVar11.m_floats;
    local_2ec = btVector3::dot(&local_248,&local_98);
    local_2e8 = (btScalar  [4])
                ::operator*((btVector3 *)
                            CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                            (btScalar *)
                            CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    local_2fc = (btScalar  [4])
                operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50)
                          ,(btVector3 *)
                           CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    fVar9 = in_RDI->m_linPos;
    pbVar4 = btVector3::operator_cast_to_float_(&in_RDI->m_depth);
    local_300 = fVar9 - *pbVar4;
    local_330 = (btScalar  [4])
                ::operator*((btVector3 *)
                            CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                            (btScalar *)
                            CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    local_320 = (btScalar  [4])
                operator+((btVector3 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50)
                          ,(btVector3 *)
                           CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    local_310 = (btScalar  [4])
                operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50)
                          ,(btVector3 *)
                           CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    local_350 = (btScalar  [4])
                ::operator*((btVector3 *)
                            CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                            (btScalar *)
                            CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    bVar11 = operator+((btVector3 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    local_340._0_8_ = bVar11.m_floats._0_8_;
    local_340._8_8_ = bVar11.m_floats._8_8_;
    local_248.m_floats[0] = local_340[0];
    local_248.m_floats[1] = local_340[1];
    local_248.m_floats[2] = local_340[2];
    local_248.m_floats[3] = local_340[3];
    local_340 = bVar11.m_floats;
    local_370 = (btScalar  [4])
                ::operator*((btVector3 *)
                            CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                            (btScalar *)
                            CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    bVar11 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    local_360._0_8_ = bVar11.m_floats._0_8_;
    local_360._8_8_ = bVar11.m_floats._8_8_;
    local_268.m_floats[0] = local_360[0];
    local_268.m_floats[1] = local_360[1];
    local_268.m_floats[2] = local_360[2];
    local_268.m_floats[3] = local_360[3];
    local_360 = bVar11.m_floats;
    local_390 = (btScalar  [4])
                ::operator*((btVector3 *)
                            CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                            (btScalar *)
                            CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    local_3a0 = (btScalar  [4])
                ::operator*((btVector3 *)
                            CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                            (btScalar *)
                            CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    bVar11 = operator+((btVector3 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    local_380._0_8_ = bVar11.m_floats._0_8_;
    local_a8.m_floats[0] = local_380[0];
    local_a8.m_floats[1] = local_380[1];
    local_380._8_8_ = bVar11.m_floats._8_8_;
    local_a8.m_floats[2] = local_380[2];
    local_a8.m_floats[3] = local_380[3];
    local_380 = bVar11.m_floats;
    local_3a4 = btVector3::length2((btVector3 *)0x222227);
    if (local_3a4 <= 1.1920929e-07) {
      btTransform::getBasis(local_40);
      bVar11 = btMatrix3x3::getColumn
                         ((btMatrix3x3 *)
                          CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                          in_stack_fffffffffffffa4c);
      local_3b8._0_8_ = bVar11.m_floats._0_8_;
      local_a8.m_floats[0] = local_3b8[0];
      local_a8.m_floats[1] = local_3b8[1];
      local_3b8._8_8_ = bVar11.m_floats._8_8_;
      local_a8.m_floats[2] = local_3b8[2];
      local_a8.m_floats[3] = local_3b8[3];
      local_3b8 = bVar11.m_floats;
    }
    else {
      local_3a8 = btSqrt(0.0);
      btVector3::operator/=
                ((btVector3 *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 (btScalar *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
    }
    bVar11 = btVector3::cross((btVector3 *)
                              CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                              (btVector3 *)
                              CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    local_3c8._0_8_ = bVar11.m_floats._0_8_;
    local_3c8._8_8_ = bVar11.m_floats._8_8_;
    local_b8.m_floats[0] = local_3c8[0];
    local_b8.m_floats[1] = local_3c8[1];
    local_b8.m_floats[2] = local_3c8[2];
    local_b8.m_floats[3] = local_3c8[3];
    local_3c8 = bVar11.m_floats;
    bVar11 = btVector3::cross((btVector3 *)
                              CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                              (btVector3 *)
                              CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    local_3d8._0_8_ = bVar11.m_floats._0_8_;
    local_3d8._8_8_ = bVar11.m_floats._8_8_;
    local_208.m_floats[0] = local_3d8[0];
    local_208.m_floats[1] = local_3d8[1];
    local_208.m_floats[2] = local_3d8[2];
    local_208.m_floats[3] = local_3d8[3];
    local_3d8 = bVar11.m_floats;
    bVar11 = btVector3::cross((btVector3 *)
                              CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                              (btVector3 *)
                              CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    local_3e8._0_8_ = bVar11.m_floats._0_8_;
    local_224.m_floats[0] = local_3e8[0];
    local_224.m_floats[1] = local_3e8[1];
    local_3e8._8_8_ = bVar11.m_floats._8_8_;
    local_224.m_floats[2] = local_3e8[2];
    local_224.m_floats[3] = local_3e8[3];
    local_3e8 = bVar11.m_floats;
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      pbVar4 = btVector3::operator_cast_to_float_(&local_208);
      *(btScalar *)(*(long *)(local_10 + 4) + (long)(local_1e8 + local_4c) * 4) = pbVar4[local_4c];
    }
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      pbVar4 = btVector3::operator_cast_to_float_(&local_224);
      *(float *)(*(long *)(local_10 + 8) + (long)(local_1e8 + local_4c) * 4) = -pbVar4[local_4c];
    }
    bVar11 = btVector3::cross((btVector3 *)
                              CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                              (btVector3 *)
                              CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    local_3f8._0_8_ = bVar11.m_floats._0_8_;
    local_3f8._8_8_ = bVar11.m_floats._8_8_;
    local_208.m_floats[0] = local_3f8[0];
    local_208.m_floats[1] = local_3f8[1];
    local_208.m_floats[2] = local_3f8[2];
    local_208.m_floats[3] = local_3f8[3];
    local_3f8 = bVar11.m_floats;
    bVar11 = btVector3::cross((btVector3 *)
                              CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                              (btVector3 *)
                              CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    local_408._0_8_ = bVar11.m_floats._0_8_;
    local_224.m_floats[0] = local_408[0];
    local_224.m_floats[1] = local_408[1];
    local_408._8_8_ = bVar11.m_floats._8_8_;
    local_224.m_floats[2] = local_408[2];
    local_224.m_floats[3] = local_408[3];
    local_408 = bVar11.m_floats;
    if (((local_6d & 1U) != 0) && (bVar3 = getSolveAngLimit(in_RDI), bVar3)) {
      btVector3::operator*=(&local_224,&local_7c);
      btVector3::operator*=(&local_208,&local_78);
    }
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      pbVar4 = btVector3::operator_cast_to_float_(&local_208);
      *(btScalar *)(*(long *)(local_10 + 4) + (long)(local_1ec + local_4c) * 4) = pbVar4[local_4c];
    }
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      pbVar4 = btVector3::operator_cast_to_float_(&local_224);
      *(float *)(*(long *)(local_10 + 8) + (long)(local_1ec + local_4c) * 4) = -pbVar4[local_4c];
    }
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      pbVar4 = btVector3::operator_cast_to_float_(&local_a8);
      *(btScalar *)(*(long *)(local_10 + 2) + (long)(local_1e8 + local_4c) * 4) = pbVar4[local_4c];
    }
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      pbVar4 = btVector3::operator_cast_to_float_(&local_b8);
      *(btScalar *)(*(long *)(local_10 + 2) + (long)(local_1ec + local_4c) * 4) = pbVar4[local_4c];
    }
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      pbVar4 = btVector3::operator_cast_to_float_(&local_a8);
      *(float *)(*(long *)(local_10 + 6) + (long)(local_1e8 + local_4c) * 4) = -pbVar4[local_4c];
    }
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      pbVar4 = btVector3::operator_cast_to_float_(&local_b8);
      *(float *)(*(long *)(local_10 + 6) + (long)(local_1ec + local_4c) * 4) = -pbVar4[local_4c];
    }
  }
  if ((in_RDI->m_flags & 0x20U) == 0) {
    local_57c = in_RDI->m_softnessOrthoLin * local_10[1];
  }
  else {
    local_57c = in_RDI->m_softnessOrthoLin;
  }
  local_13c = local_57c;
  fVar9 = *local_10;
  local_140 = fVar9 * local_57c;
  bVar6 = btVector3::dot(&local_a8,&local_64);
  fVar2 = local_140;
  local_43c = fVar9 * local_57c * bVar6;
  *(float *)(*(long *)(local_10 + 0xc) + (long)local_1e8 * 4) = local_43c;
  bVar6 = btVector3::dot(&local_b8,&local_64);
  local_43c = fVar2 * bVar6;
  *(float *)(*(long *)(local_10 + 0xc) + (long)local_1ec * 4) = local_43c;
  if ((in_RDI->m_flags & 0x10U) != 0) {
    *(btScalar *)(*(long *)(local_10 + 0xe) + (long)local_1e8 * 4) = in_RDI->m_cfmOrthoLin;
    *(btScalar *)(*(long *)(local_10 + 0xe) + (long)local_1ec * 4) = in_RDI->m_cfmOrthoLin;
  }
  local_15c = 0.0;
  local_160 = 0;
  bVar3 = getSolveLinLimit(in_RDI);
  if (bVar3) {
    local_15c = getLinDepth((btSliderConstraint *)0x222dad);
    local_15c = local_15c * local_54;
    local_160 = 1;
    if (0.0 < local_15c) {
      local_160 = 2;
    }
  }
  local_164 = 0;
  bVar3 = getPoweredLinMotor(in_RDI);
  if (bVar3) {
    local_164 = 1;
  }
  if ((local_160 != 0) || (local_164 != 0)) {
    local_154 = local_154 + 1;
    local_158 = local_154 * (int)local_10[10];
    pbVar4 = btVector3::operator_cast_to_float_(&local_98);
    *(btScalar *)(*(long *)(local_10 + 2) + (long)local_158 * 4) = *pbVar4;
    pbVar4 = btVector3::operator_cast_to_float_(&local_98);
    *(btScalar *)(*(long *)(local_10 + 2) + (long)(local_158 + 1) * 4) = pbVar4[1];
    pbVar4 = btVector3::operator_cast_to_float_(&local_98);
    *(btScalar *)(*(long *)(local_10 + 2) + (long)(local_158 + 2) * 4) = pbVar4[2];
    pbVar4 = btVector3::operator_cast_to_float_(&local_98);
    *(float *)(*(long *)(local_10 + 6) + (long)local_158 * 4) = -*pbVar4;
    pbVar4 = btVector3::operator_cast_to_float_(&local_98);
    *(float *)(*(long *)(local_10 + 6) + (long)(local_158 + 1) * 4) = -pbVar4[1];
    pbVar4 = btVector3::operator_cast_to_float_(&local_98);
    *(float *)(*(long *)(local_10 + 6) + (long)(local_158 + 2) * 4) = -pbVar4[2];
    if ((in_RDI->m_useOffsetForConstraintFrame & 1U) == 0) {
      btVector3::btVector3(&local_46c);
      bVar11 = btVector3::cross((btVector3 *)
                                CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                                (btVector3 *)
                                CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
      bVar6 = local_78;
      local_47c = bVar11.m_floats._0_8_;
      local_46c.m_floats[0] = local_47c[0];
      local_46c.m_floats[1] = local_47c[1];
      local_474 = bVar11.m_floats._8_8_;
      local_46c.m_floats[2] = local_474[0];
      local_46c.m_floats[3] = local_474[1];
      pbVar4 = btVector3::operator_cast_to_float_(&local_46c);
      bVar7 = local_78;
      *(float *)(*(long *)(local_10 + 4) + (long)local_158 * 4) = bVar6 * *pbVar4;
      pbVar4 = btVector3::operator_cast_to_float_(&local_46c);
      bVar6 = local_78;
      *(float *)(*(long *)(local_10 + 4) + (long)(local_158 + 1) * 4) = bVar7 * pbVar4[1];
      pbVar4 = btVector3::operator_cast_to_float_(&local_46c);
      fVar9 = local_7c;
      *(float *)(*(long *)(local_10 + 4) + (long)(local_158 + 2) * 4) = bVar6 * pbVar4[2];
      pbVar4 = btVector3::operator_cast_to_float_(&local_46c);
      fVar2 = local_7c;
      *(float *)(*(long *)(local_10 + 8) + (long)local_158 * 4) = fVar9 * *pbVar4;
      pbVar4 = btVector3::operator_cast_to_float_(&local_46c);
      fVar9 = local_7c;
      *(float *)(*(long *)(local_10 + 8) + (long)(local_158 + 1) * 4) = fVar2 * pbVar4[1];
      pbVar4 = btVector3::operator_cast_to_float_(&local_46c);
      *(float *)(*(long *)(local_10 + 8) + (long)(local_158 + 2) * 4) = fVar9 * pbVar4[2];
    }
    else if ((local_6d & 1U) == 0) {
      bVar11 = btVector3::cross((btVector3 *)
                                CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                                (btVector3 *)
                                CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
      local_44c._0_8_ = bVar11.m_floats._0_8_;
      local_44c._8_8_ = bVar11.m_floats._8_8_;
      local_208.m_floats[0] = local_44c[0];
      local_208.m_floats[1] = local_44c[1];
      local_208.m_floats[2] = local_44c[2];
      local_208.m_floats[3] = local_44c[3];
      local_44c = bVar11.m_floats;
      bVar11 = btVector3::cross((btVector3 *)
                                CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                                (btVector3 *)
                                CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
      local_45c._0_8_ = bVar11.m_floats._0_8_;
      local_224.m_floats[0] = local_45c[0];
      local_224.m_floats[1] = local_45c[1];
      local_45c._8_8_ = bVar11.m_floats._8_8_;
      local_224.m_floats[2] = local_45c[2];
      local_224.m_floats[3] = local_45c[3];
      local_45c = bVar11.m_floats;
      pbVar4 = btVector3::operator_cast_to_float_(&local_208);
      *(btScalar *)(*(long *)(local_10 + 4) + (long)local_158 * 4) = *pbVar4;
      pbVar4 = btVector3::operator_cast_to_float_(&local_208);
      *(btScalar *)(*(long *)(local_10 + 4) + (long)(local_158 + 1) * 4) = pbVar4[1];
      pbVar4 = btVector3::operator_cast_to_float_(&local_208);
      *(btScalar *)(*(long *)(local_10 + 4) + (long)(local_158 + 2) * 4) = pbVar4[2];
      pbVar4 = btVector3::operator_cast_to_float_(&local_224);
      *(float *)(*(long *)(local_10 + 8) + (long)local_158 * 4) = -*pbVar4;
      pbVar4 = btVector3::operator_cast_to_float_(&local_224);
      *(float *)(*(long *)(local_10 + 8) + (long)(local_158 + 1) * 4) = -pbVar4[1];
      pbVar4 = btVector3::operator_cast_to_float_(&local_224);
      *(float *)(*(long *)(local_10 + 8) + (long)(local_158 + 2) * 4) = -pbVar4[2];
    }
    bVar6 = getLowerLinLimit(in_RDI);
    bVar7 = getUpperLinLimit(in_RDI);
    if (local_160 != 0) {
      if ((bVar6 == bVar7) && (!NAN(bVar6) && !NAN(bVar7))) {
        local_164 = 0;
      }
    }
    *(undefined4 *)(*(long *)(local_10 + 0xc) + (long)local_158 * 4) = 0;
    *(undefined4 *)(*(long *)(local_10 + 0x10) + (long)local_158 * 4) = 0;
    *(undefined4 *)(*(long *)(local_10 + 0x12) + (long)local_158 * 4) = 0;
    if ((in_RDI->m_flags & 0x200U) == 0) {
      local_13c = local_10[1];
    }
    else {
      local_13c = in_RDI->m_softnessLimLin;
    }
    if (local_164 != 0) {
      if ((in_RDI->m_flags & 1U) != 0) {
        *(btScalar *)(*(long *)(local_10 + 0xe) + (long)local_158 * 4) = in_RDI->m_cfmDirLin;
      }
      bVar8 = getTargetLinMotorVelocity(in_RDI);
      bVar8 = btTypedConstraint::getMotorFactor
                        (&in_RDI->super_btTypedConstraint,in_RDI->m_linPos,in_RDI->m_lowerLinLimit,
                         in_RDI->m_upperLinLimit,bVar8,*local_10 * local_13c);
      fVar9 = local_54 * bVar8;
      bVar8 = getTargetLinMotorVelocity(in_RDI);
      *(float *)(*(long *)(local_10 + 0xc) + (long)local_158 * 4) =
           -fVar9 * bVar8 + *(float *)(*(long *)(local_10 + 0xc) + (long)local_158 * 4);
      bVar8 = getMaxLinMotorForce(in_RDI);
      *(float *)(*(long *)(local_10 + 0x10) + (long)local_158 * 4) =
           -bVar8 / *local_10 + *(float *)(*(long *)(local_10 + 0x10) + (long)local_158 * 4);
      bVar8 = getMaxLinMotorForce(in_RDI);
      *(float *)(*(long *)(local_10 + 0x12) + (long)local_158 * 4) =
           bVar8 / *local_10 + *(float *)(*(long *)(local_10 + 0x12) + (long)local_158 * 4);
    }
    if (local_160 != 0) {
      local_140 = *local_10 * local_13c;
      *(float *)(*(long *)(local_10 + 0xc) + (long)local_158 * 4) =
           local_140 * local_15c + *(float *)(*(long *)(local_10 + 0xc) + (long)local_158 * 4);
      if ((in_RDI->m_flags & 0x100U) != 0) {
        *(btScalar *)(*(long *)(local_10 + 0xe) + (long)local_158 * 4) = in_RDI->m_cfmLimLin;
      }
      if ((bVar6 != bVar7) || (NAN(bVar6) || NAN(bVar7))) {
        if (local_160 == 1) {
          *(undefined4 *)(*(long *)(local_10 + 0x10) + (long)local_158 * 4) = 0xff7fffff;
          *(undefined4 *)(*(long *)(local_10 + 0x12) + (long)local_158 * 4) = 0;
        }
        else {
          *(undefined4 *)(*(long *)(local_10 + 0x10) + (long)local_158 * 4) = 0;
          *(undefined4 *)(*(long *)(local_10 + 0x12) + (long)local_158 * 4) = 0x7f7fffff;
        }
      }
      else {
        *(undefined4 *)(*(long *)(local_10 + 0x10) + (long)local_158 * 4) = 0xff7fffff;
        *(undefined4 *)(*(long *)(local_10 + 0x12) + (long)local_158 * 4) = 0x7f7fffff;
      }
      bVar6 = getDampingLimLin(in_RDI);
      bVar6 = btFabs(1.0 - bVar6);
      if (0.0 < bVar6) {
        bVar7 = btVector3::dot(local_28,&local_98);
        bVar8 = btVector3::dot(local_30,&local_98);
        fVar9 = local_54 * (bVar7 - bVar8);
        if (local_160 == 1) {
          if ((fVar9 < 0.0) &&
             (fVar9 = -bVar6 * fVar9,
             pfVar1 = (float *)(*(long *)(local_10 + 0xc) + (long)local_158 * 4),
             *pfVar1 <= fVar9 && fVar9 != *pfVar1)) {
            *(float *)(*(long *)(local_10 + 0xc) + (long)local_158 * 4) = fVar9;
          }
        }
        else if ((0.0 < fVar9) &&
                (-bVar6 * fVar9 < *(float *)(*(long *)(local_10 + 0xc) + (long)local_158 * 4))) {
          *(float *)(*(long *)(local_10 + 0xc) + (long)local_158 * 4) = -bVar6 * fVar9;
        }
      }
      bVar6 = getSoftnessLimLin(in_RDI);
      *(float *)(*(long *)(local_10 + 0xc) + (long)local_158 * 4) =
           bVar6 * *(float *)(*(long *)(local_10 + 0xc) + (long)local_158 * 4);
    }
  }
  local_15c = 0.0;
  local_160 = 0;
  bVar3 = getSolveAngLimit(in_RDI);
  if (bVar3) {
    local_15c = getAngDepth(in_RDI);
    local_160 = 2;
    if (0.0 < local_15c) {
      local_160 = 1;
    }
  }
  local_164 = 0;
  bVar3 = getPoweredAngMotor(in_RDI);
  if (bVar3) {
    local_164 = 1;
  }
  if ((local_160 != 0) || (local_164 != 0)) {
    local_154 = local_154 + 1;
    local_158 = local_154 * (int)local_10[10];
    pbVar4 = btVector3::operator_cast_to_float_(&local_98);
    *(btScalar *)(*(long *)(local_10 + 4) + (long)local_158 * 4) = *pbVar4;
    pbVar4 = btVector3::operator_cast_to_float_(&local_98);
    *(btScalar *)(*(long *)(local_10 + 4) + (long)(local_158 + 1) * 4) = pbVar4[1];
    pbVar4 = btVector3::operator_cast_to_float_(&local_98);
    *(btScalar *)(*(long *)(local_10 + 4) + (long)(local_158 + 2) * 4) = pbVar4[2];
    pbVar4 = btVector3::operator_cast_to_float_(&local_98);
    *(float *)(*(long *)(local_10 + 8) + (long)local_158 * 4) = -*pbVar4;
    pbVar4 = btVector3::operator_cast_to_float_(&local_98);
    *(float *)(*(long *)(local_10 + 8) + (long)(local_158 + 1) * 4) = -pbVar4[1];
    pbVar4 = btVector3::operator_cast_to_float_(&local_98);
    *(float *)(*(long *)(local_10 + 8) + (long)(local_158 + 2) * 4) = -pbVar4[2];
    bVar6 = getLowerAngLimit(in_RDI);
    bVar7 = getUpperAngLimit(in_RDI);
    if (local_160 != 0) {
      if ((bVar6 == bVar7) && (!NAN(bVar6) && !NAN(bVar7))) {
        local_164 = 0;
      }
    }
    if ((in_RDI->m_flags & 0x800U) == 0) {
      local_13c = local_10[1];
    }
    else {
      local_13c = in_RDI->m_softnessLimAng;
    }
    if (local_164 != 0) {
      if ((in_RDI->m_flags & 4U) != 0) {
        *(btScalar *)(*(long *)(local_10 + 0xe) + (long)local_158 * 4) = in_RDI->m_cfmDirAng;
      }
      bVar8 = in_RDI->m_angPos;
      bVar10 = in_RDI->m_lowerAngLimit;
      uppLim = in_RDI->m_upperAngLimit;
      vel_00 = getTargetAngMotorVelocity(in_RDI);
      bVar8 = btTypedConstraint::getMotorFactor
                        (&in_RDI->super_btTypedConstraint,bVar8,bVar10,uppLim,vel_00,
                         *local_10 * local_13c);
      bVar10 = getTargetAngMotorVelocity(in_RDI);
      *(float *)(*(long *)(local_10 + 0xc) + (long)local_158 * 4) = bVar8 * bVar10;
      bVar8 = getMaxAngMotorForce(in_RDI);
      *(float *)(*(long *)(local_10 + 0x10) + (long)local_158 * 4) = -bVar8 / *local_10;
      bVar8 = getMaxAngMotorForce(in_RDI);
      *(float *)(*(long *)(local_10 + 0x12) + (long)local_158 * 4) = bVar8 / *local_10;
    }
    if (local_160 != 0) {
      local_140 = *local_10 * local_13c;
      *(float *)(*(long *)(local_10 + 0xc) + (long)local_158 * 4) =
           local_140 * local_15c + *(float *)(*(long *)(local_10 + 0xc) + (long)local_158 * 4);
      if ((in_RDI->m_flags & 0x400U) != 0) {
        *(btScalar *)(*(long *)(local_10 + 0xe) + (long)local_158 * 4) = in_RDI->m_cfmLimAng;
      }
      if ((bVar6 != bVar7) || (NAN(bVar6) || NAN(bVar7))) {
        if (local_160 == 1) {
          *(undefined4 *)(*(long *)(local_10 + 0x10) + (long)local_158 * 4) = 0;
          *(undefined4 *)(*(long *)(local_10 + 0x12) + (long)local_158 * 4) = 0x7f7fffff;
        }
        else {
          *(undefined4 *)(*(long *)(local_10 + 0x10) + (long)local_158 * 4) = 0xff7fffff;
          *(undefined4 *)(*(long *)(local_10 + 0x12) + (long)local_158 * 4) = 0;
        }
      }
      else {
        *(undefined4 *)(*(long *)(local_10 + 0x10) + (long)local_158 * 4) = 0xff7fffff;
        *(undefined4 *)(*(long *)(local_10 + 0x12) + (long)local_158 * 4) = 0x7f7fffff;
      }
      bVar6 = getDampingLimAng(in_RDI);
      bVar6 = btFabs(1.0 - bVar6);
      if (0.0 < bVar6) {
        pbVar5 = btRigidBody::getAngularVelocity((in_RDI->super_btTypedConstraint).m_rbA);
        bVar7 = btVector3::dot(pbVar5,&local_98);
        pbVar5 = btRigidBody::getAngularVelocity((in_RDI->super_btTypedConstraint).m_rbB);
        bVar8 = btVector3::dot(pbVar5,&local_98);
        fVar9 = bVar7 - bVar8;
        if (local_160 == 1) {
          if ((fVar9 < 0.0) &&
             (fVar9 = -bVar6 * fVar9,
             pfVar1 = (float *)(*(long *)(local_10 + 0xc) + (long)local_158 * 4),
             *pfVar1 <= fVar9 && fVar9 != *pfVar1)) {
            *(float *)(*(long *)(local_10 + 0xc) + (long)local_158 * 4) = fVar9;
          }
        }
        else if ((0.0 < fVar9) &&
                (-bVar6 * fVar9 < *(float *)(*(long *)(local_10 + 0xc) + (long)local_158 * 4))) {
          *(float *)(*(long *)(local_10 + 0xc) + (long)local_158 * 4) = -bVar6 * fVar9;
        }
      }
      bVar6 = getSoftnessLimAng(in_RDI);
      *(float *)(*(long *)(local_10 + 0xc) + (long)local_158 * 4) =
           bVar6 * *(float *)(*(long *)(local_10 + 0xc) + (long)local_158 * 4);
    }
  }
  return;
}

Assistant:

void btSliderConstraint::getInfo2NonVirtual(btConstraintInfo2* info, const btTransform& transA,const btTransform& transB, const btVector3& linVelA,const btVector3& linVelB, btScalar rbAinvMass,btScalar rbBinvMass  )
{
	const btTransform& trA = getCalculatedTransformA();
	const btTransform& trB = getCalculatedTransformB();
	
	btAssert(!m_useSolveConstraintObsolete);
	int i, s = info->rowskip;
	
	btScalar signFact = m_useLinearReferenceFrameA ? btScalar(1.0f) : btScalar(-1.0f);
	
	// difference between frames in WCS
	btVector3 ofs = trB.getOrigin() - trA.getOrigin();
	// now get weight factors depending on masses
	btScalar miA = rbAinvMass;
	btScalar miB = rbBinvMass;
	bool hasStaticBody = (miA < SIMD_EPSILON) || (miB < SIMD_EPSILON);
	btScalar miS = miA + miB;
	btScalar factA, factB;
	if(miS > btScalar(0.f))
	{
		factA = miB / miS;
	}
	else 
	{
		factA = btScalar(0.5f);
	}
	factB = btScalar(1.0f) - factA;
	btVector3 ax1, p, q;
	btVector3 ax1A = trA.getBasis().getColumn(0);
	btVector3 ax1B = trB.getBasis().getColumn(0);
	if(m_useOffsetForConstraintFrame)
	{
		// get the desired direction of slider axis
		// as weighted sum of X-orthos of frameA and frameB in WCS
		ax1 = ax1A * factA + ax1B * factB;
		ax1.normalize();
		// construct two orthos to slider axis
		btPlaneSpace1 (ax1, p, q);
	}
	else
	{ // old way - use frameA
		ax1 = trA.getBasis().getColumn(0);
		// get 2 orthos to slider axis (Y, Z)
		p = trA.getBasis().getColumn(1);
		q = trA.getBasis().getColumn(2);
	}
	// make rotations around these orthos equal
	// the slider axis should be the only unconstrained
	// rotational axis, the angular velocity of the two bodies perpendicular to
	// the slider axis should be equal. thus the constraint equations are
	//    p*w1 - p*w2 = 0
	//    q*w1 - q*w2 = 0
	// where p and q are unit vectors normal to the slider axis, and w1 and w2
	// are the angular velocity vectors of the two bodies.
	info->m_J1angularAxis[0] = p[0];
	info->m_J1angularAxis[1] = p[1];
	info->m_J1angularAxis[2] = p[2];
	info->m_J1angularAxis[s+0] = q[0];
	info->m_J1angularAxis[s+1] = q[1];
	info->m_J1angularAxis[s+2] = q[2];

	info->m_J2angularAxis[0] = -p[0];
	info->m_J2angularAxis[1] = -p[1];
	info->m_J2angularAxis[2] = -p[2];
	info->m_J2angularAxis[s+0] = -q[0];
	info->m_J2angularAxis[s+1] = -q[1];
	info->m_J2angularAxis[s+2] = -q[2];
	// compute the right hand side of the constraint equation. set relative
	// body velocities along p and q to bring the slider back into alignment.
	// if ax1A,ax1B are the unit length slider axes as computed from bodyA and
	// bodyB, we need to rotate both bodies along the axis u = (ax1 x ax2).
	// if "theta" is the angle between ax1 and ax2, we need an angular velocity
	// along u to cover angle erp*theta in one step :
	//   |angular_velocity| = angle/time = erp*theta / stepsize
	//                      = (erp*fps) * theta
	//    angular_velocity  = |angular_velocity| * (ax1 x ax2) / |ax1 x ax2|
	//                      = (erp*fps) * theta * (ax1 x ax2) / sin(theta)
	// ...as ax1 and ax2 are unit length. if theta is smallish,
	// theta ~= sin(theta), so
	//    angular_velocity  = (erp*fps) * (ax1 x ax2)
	// ax1 x ax2 is in the plane space of ax1, so we project the angular
	// velocity to p and q to find the right hand side.
//	btScalar k = info->fps * info->erp * getSoftnessOrthoAng();
	btScalar currERP = (m_flags & BT_SLIDER_FLAGS_ERP_ORTANG) ? m_softnessOrthoAng : m_softnessOrthoAng * info->erp;
	btScalar k = info->fps * currERP;

	btVector3 u = ax1A.cross(ax1B);
	info->m_constraintError[0] = k * u.dot(p);
	info->m_constraintError[s] = k * u.dot(q);
	if(m_flags & BT_SLIDER_FLAGS_CFM_ORTANG)
	{
		info->cfm[0] = m_cfmOrthoAng;
		info->cfm[s] = m_cfmOrthoAng;
	}

	int nrow = 1; // last filled row
	int srow;
	btScalar limit_err;
	int limit;
	int powered;

	// next two rows. 
	// we want: velA + wA x relA == velB + wB x relB ... but this would
	// result in three equations, so we project along two orthos to the slider axis

	btTransform bodyA_trans = transA;
	btTransform bodyB_trans = transB;
	nrow++;
	int s2 = nrow * s;
	nrow++;
	int s3 = nrow * s;
	btVector3 tmpA(0,0,0), tmpB(0,0,0), relA(0,0,0), relB(0,0,0), c(0,0,0);
	if(m_useOffsetForConstraintFrame)
	{
		// get vector from bodyB to frameB in WCS
		relB = trB.getOrigin() - bodyB_trans.getOrigin();
		// get its projection to slider axis
		btVector3 projB = ax1 * relB.dot(ax1);
		// get vector directed from bodyB to slider axis (and orthogonal to it)
		btVector3 orthoB = relB - projB;
		// same for bodyA
		relA = trA.getOrigin() - bodyA_trans.getOrigin();
		btVector3 projA = ax1 * relA.dot(ax1);
		btVector3 orthoA = relA - projA;
		// get desired offset between frames A and B along slider axis
		btScalar sliderOffs = m_linPos - m_depth[0];
		// desired vector from projection of center of bodyA to projection of center of bodyB to slider axis
		btVector3 totalDist = projA + ax1 * sliderOffs - projB;
		// get offset vectors relA and relB
		relA = orthoA + totalDist * factA;
		relB = orthoB - totalDist * factB;
		// now choose average ortho to slider axis
		p = orthoB * factA + orthoA * factB;
		btScalar len2 = p.length2();
		if(len2 > SIMD_EPSILON)
		{
			p /= btSqrt(len2);
		}
		else
		{
			p = trA.getBasis().getColumn(1);
		}
		// make one more ortho
		q = ax1.cross(p);
		// fill two rows
		tmpA = relA.cross(p);
		tmpB = relB.cross(p);
		for (i=0; i<3; i++) info->m_J1angularAxis[s2+i] = tmpA[i];
		for (i=0; i<3; i++) info->m_J2angularAxis[s2+i] = -tmpB[i];
		tmpA = relA.cross(q);
		tmpB = relB.cross(q);
		if(hasStaticBody && getSolveAngLimit())
		{ // to make constraint between static and dynamic objects more rigid
			// remove wA (or wB) from equation if angular limit is hit
			tmpB *= factB;
			tmpA *= factA;
		}
		for (i=0; i<3; i++) info->m_J1angularAxis[s3+i] = tmpA[i];
		for (i=0; i<3; i++) info->m_J2angularAxis[s3+i] = -tmpB[i];
		for (i=0; i<3; i++) info->m_J1linearAxis[s2+i] = p[i];
		for (i=0; i<3; i++) info->m_J1linearAxis[s3+i] = q[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s2+i] = -p[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s3+i] = -q[i];
	}
	else
	{	// old way - maybe incorrect if bodies are not on the slider axis
		// see discussion "Bug in slider constraint" http://bulletphysics.org/Bullet/phpBB3/viewtopic.php?f=9&t=4024&start=0
		c = bodyB_trans.getOrigin() - bodyA_trans.getOrigin();
		btVector3 tmp = c.cross(p);
		for (i=0; i<3; i++) info->m_J1angularAxis[s2+i] = factA*tmp[i];
		for (i=0; i<3; i++) info->m_J2angularAxis[s2+i] = factB*tmp[i];
		tmp = c.cross(q);
		for (i=0; i<3; i++) info->m_J1angularAxis[s3+i] = factA*tmp[i];
		for (i=0; i<3; i++) info->m_J2angularAxis[s3+i] = factB*tmp[i];

		for (i=0; i<3; i++) info->m_J1linearAxis[s2+i] = p[i];
		for (i=0; i<3; i++) info->m_J1linearAxis[s3+i] = q[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s2+i] = -p[i];
		for (i=0; i<3; i++) info->m_J2linearAxis[s3+i] = -q[i];
	}
	// compute two elements of right hand side

	//	k = info->fps * info->erp * getSoftnessOrthoLin();
	currERP = (m_flags & BT_SLIDER_FLAGS_ERP_ORTLIN) ? m_softnessOrthoLin : m_softnessOrthoLin * info->erp;
	k = info->fps * currERP;

	btScalar rhs = k * p.dot(ofs);
	info->m_constraintError[s2] = rhs;
	rhs = k * q.dot(ofs);
	info->m_constraintError[s3] = rhs;
	if(m_flags & BT_SLIDER_FLAGS_CFM_ORTLIN)
	{
		info->cfm[s2] = m_cfmOrthoLin;
		info->cfm[s3] = m_cfmOrthoLin;
	}


	// check linear limits
	limit_err = btScalar(0.0);
	limit = 0;
	if(getSolveLinLimit())
	{
		limit_err = getLinDepth() *  signFact;
		limit = (limit_err > btScalar(0.0)) ? 2 : 1;
	}
	powered = 0;
	if(getPoweredLinMotor())
	{
		powered = 1;
	}
	// if the slider has joint limits or motor, add in the extra row
	if (limit || powered) 
	{
		nrow++;
		srow = nrow * info->rowskip;
		info->m_J1linearAxis[srow+0] = ax1[0];
		info->m_J1linearAxis[srow+1] = ax1[1];
		info->m_J1linearAxis[srow+2] = ax1[2];
		info->m_J2linearAxis[srow+0] = -ax1[0];
		info->m_J2linearAxis[srow+1] = -ax1[1];
		info->m_J2linearAxis[srow+2] = -ax1[2];
		// linear torque decoupling step:
		//
		// we have to be careful that the linear constraint forces (+/- ax1) applied to the two bodies
		// do not create a torque couple. in other words, the points that the
		// constraint force is applied at must lie along the same ax1 axis.
		// a torque couple will result in limited slider-jointed free
		// bodies from gaining angular momentum.
		if(m_useOffsetForConstraintFrame)
		{
			// this is needed only when bodyA and bodyB are both dynamic.
			if(!hasStaticBody)
			{
				tmpA = relA.cross(ax1);
				tmpB = relB.cross(ax1);
				info->m_J1angularAxis[srow+0] = tmpA[0];
				info->m_J1angularAxis[srow+1] = tmpA[1];
				info->m_J1angularAxis[srow+2] = tmpA[2];
				info->m_J2angularAxis[srow+0] = -tmpB[0];
				info->m_J2angularAxis[srow+1] = -tmpB[1];
				info->m_J2angularAxis[srow+2] = -tmpB[2];
			}
		}
		else
		{ // The old way. May be incorrect if bodies are not on the slider axis
			btVector3 ltd;	// Linear Torque Decoupling vector (a torque)
			ltd = c.cross(ax1);
			info->m_J1angularAxis[srow+0] = factA*ltd[0];
			info->m_J1angularAxis[srow+1] = factA*ltd[1];
			info->m_J1angularAxis[srow+2] = factA*ltd[2];
			info->m_J2angularAxis[srow+0] = factB*ltd[0];
			info->m_J2angularAxis[srow+1] = factB*ltd[1];
			info->m_J2angularAxis[srow+2] = factB*ltd[2];
		}
		// right-hand part
		btScalar lostop = getLowerLinLimit();
		btScalar histop = getUpperLinLimit();
		if(limit && (lostop == histop))
		{  // the joint motor is ineffective
			powered = 0;
		}
		info->m_constraintError[srow] = 0.;
		info->m_lowerLimit[srow] = 0.;
		info->m_upperLimit[srow] = 0.;
		currERP = (m_flags & BT_SLIDER_FLAGS_ERP_LIMLIN) ? m_softnessLimLin : info->erp;
		if(powered)
		{
			if(m_flags & BT_SLIDER_FLAGS_CFM_DIRLIN)
			{
				info->cfm[srow] = m_cfmDirLin;
			}
			btScalar tag_vel = getTargetLinMotorVelocity();
			btScalar mot_fact = getMotorFactor(m_linPos, m_lowerLinLimit, m_upperLinLimit, tag_vel, info->fps * currERP);
			info->m_constraintError[srow] -= signFact * mot_fact * getTargetLinMotorVelocity();
			info->m_lowerLimit[srow] += -getMaxLinMotorForce() / info->fps;
			info->m_upperLimit[srow] += getMaxLinMotorForce() / info->fps;
		}
		if(limit)
		{
			k = info->fps * currERP;
			info->m_constraintError[srow] += k * limit_err;
			if(m_flags & BT_SLIDER_FLAGS_CFM_LIMLIN)
			{
				info->cfm[srow] = m_cfmLimLin;
			}
			if(lostop == histop) 
			{	// limited low and high simultaneously
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			else if(limit == 1) 
			{ // low limit
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = 0;
			}
			else 
			{ // high limit
				info->m_lowerLimit[srow] = 0;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			// bounce (we'll use slider parameter abs(1.0 - m_dampingLimLin) for that)
			btScalar bounce = btFabs(btScalar(1.0) - getDampingLimLin());
			if(bounce > btScalar(0.0))
			{
				btScalar vel = linVelA.dot(ax1);
				vel -= linVelB.dot(ax1);
				vel *= signFact;
				// only apply bounce if the velocity is incoming, and if the
				// resulting c[] exceeds what we already have.
				if(limit == 1)
				{	// low limit
					if(vel < 0)
					{
						btScalar newc = -bounce * vel;
						if (newc > info->m_constraintError[srow])
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
				else
				{ // high limit - all those computations are reversed
					if(vel > 0)
					{
						btScalar newc = -bounce * vel;
						if(newc < info->m_constraintError[srow]) 
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
			}
			info->m_constraintError[srow] *= getSoftnessLimLin();
		} // if(limit)
	} // if linear limit
	// check angular limits
	limit_err = btScalar(0.0);
	limit = 0;
	if(getSolveAngLimit())
	{
		limit_err = getAngDepth();
		limit = (limit_err > btScalar(0.0)) ? 1 : 2;
	}
	// if the slider has joint limits, add in the extra row
	powered = 0;
	if(getPoweredAngMotor())
	{
		powered = 1;
	}
	if(limit || powered) 
	{
		nrow++;
		srow = nrow * info->rowskip;
		info->m_J1angularAxis[srow+0] = ax1[0];
		info->m_J1angularAxis[srow+1] = ax1[1];
		info->m_J1angularAxis[srow+2] = ax1[2];

		info->m_J2angularAxis[srow+0] = -ax1[0];
		info->m_J2angularAxis[srow+1] = -ax1[1];
		info->m_J2angularAxis[srow+2] = -ax1[2];

		btScalar lostop = getLowerAngLimit();
		btScalar histop = getUpperAngLimit();
		if(limit && (lostop == histop))
		{  // the joint motor is ineffective
			powered = 0;
		}
		currERP = (m_flags & BT_SLIDER_FLAGS_ERP_LIMANG) ? m_softnessLimAng : info->erp;
		if(powered)
		{
			if(m_flags & BT_SLIDER_FLAGS_CFM_DIRANG)
			{
				info->cfm[srow] = m_cfmDirAng;
			}
			btScalar mot_fact = getMotorFactor(m_angPos, m_lowerAngLimit, m_upperAngLimit, getTargetAngMotorVelocity(), info->fps * currERP);
			info->m_constraintError[srow] = mot_fact * getTargetAngMotorVelocity();
			info->m_lowerLimit[srow] = -getMaxAngMotorForce() / info->fps;
			info->m_upperLimit[srow] = getMaxAngMotorForce() / info->fps;
		}
		if(limit)
		{
			k = info->fps * currERP;
			info->m_constraintError[srow] += k * limit_err;
			if(m_flags & BT_SLIDER_FLAGS_CFM_LIMANG)
			{
				info->cfm[srow] = m_cfmLimAng;
			}
			if(lostop == histop) 
			{
				// limited low and high simultaneously
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			else if(limit == 1) 
			{ // low limit
				info->m_lowerLimit[srow] = 0;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			}
			else 
			{ // high limit
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = 0;
			}
			// bounce (we'll use slider parameter abs(1.0 - m_dampingLimAng) for that)
			btScalar bounce = btFabs(btScalar(1.0) - getDampingLimAng());
			if(bounce > btScalar(0.0))
			{
				btScalar vel = m_rbA.getAngularVelocity().dot(ax1);
				vel -= m_rbB.getAngularVelocity().dot(ax1);
				// only apply bounce if the velocity is incoming, and if the
				// resulting c[] exceeds what we already have.
				if(limit == 1)
				{	// low limit
					if(vel < 0)
					{
						btScalar newc = -bounce * vel;
						if(newc > info->m_constraintError[srow])
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
				else
				{	// high limit - all those computations are reversed
					if(vel > 0)
					{
						btScalar newc = -bounce * vel;
						if(newc < info->m_constraintError[srow])
						{
							info->m_constraintError[srow] = newc;
						}
					}
				}
			}
			info->m_constraintError[srow] *= getSoftnessLimAng();
		} // if(limit)
	} // if angular limit or powered
}